

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O1

int gmtime_s(tm *tmDest,time_t *sourceTime)

{
  int iVar1;
  
  iVar1 = 0x16;
  if (tmDest != (tm *)0x0) {
    if ((sourceTime == (time_t *)0x0) || (*sourceTime < 0)) {
      tmDest->tm_isdst = -1;
      *(undefined4 *)&tmDest->field_0x24 = 0xffffffff;
      *(undefined4 *)&tmDest->tm_gmtoff = 0xffffffff;
      *(undefined4 *)((long)&tmDest->tm_gmtoff + 4) = 0xffffffff;
      tmDest->tm_mon = -1;
      tmDest->tm_year = -1;
      tmDest->tm_wday = -1;
      tmDest->tm_yday = -1;
      tmDest->tm_sec = -1;
      tmDest->tm_min = -1;
      tmDest->tm_hour = -1;
      tmDest->tm_mday = -1;
      tmDest->tm_zone = (char *)0xffffffffffffffff;
      return iVar1;
    }
    gmtime(sourceTime);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int gmtime_s( struct tm* tmDest, const std::time_t* sourceTime )
{
	if( tmDest == nullptr )
		return EINVAL;

	if( sourceTime == nullptr || *sourceTime < 0 )
	{
		std::memset(tmDest, 0xff, sizeof(tm));
		return EINVAL;
	}

	tmDest = gmtime( sourceTime );
	return 0;
}